

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_button_behavior(nk_flags *state,nk_rect r,nk_input *i,nk_button_behavior behavior)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar5 = *state & 2 | 4;
  *state = uVar5;
  if (i == (nk_input *)0x0) {
    return 0;
  }
  fVar1 = (i->mouse).pos.x;
  iVar3 = 0;
  fVar8 = r.x;
  fVar11 = r.w + fVar8;
  fVar10 = r.h;
  fVar9 = r.y;
  iVar4 = 0;
  if ((((fVar8 <= fVar1) && (iVar4 = iVar3, fVar1 <= fVar11)) &&
      (fVar1 = (i->mouse).pos.y, fVar9 <= fVar1)) && (fVar1 <= fVar9 + fVar10)) {
    *state = 0x12;
    uVar5 = (uint)((i->mouse).buttons[0].down != 0) * 0x10 + 0x12;
    *state = uVar5;
    fVar1 = (i->mouse).buttons[0].clicked_pos.x;
    if ((((fVar8 <= fVar1) && (fVar1 <= fVar11)) &&
        ((fVar1 = (i->mouse).buttons[0].clicked_pos.y, fVar9 <= fVar1 &&
         ((fVar1 <= fVar9 + fVar10 &&
          (iVar4 = (i->mouse).buttons[0].down, behavior == NK_BUTTON_DEFAULT)))))) &&
       ((bVar7 = iVar4 != 0, iVar4 = iVar3, bVar7 && ((i->mouse).buttons[0].clicked != 0)))) {
      iVar4 = 1;
    }
  }
  fVar1 = (i->mouse).prev.x;
  if ((((uVar5 & 0x10) == 0) ||
      ((((uVar6 = 8, fVar8 <= fVar1 && (fVar1 <= fVar11)) &&
        (fVar2 = (i->mouse).prev.y, fVar9 <= fVar2)) && (fVar2 <= fVar9 + fVar10)))) &&
     (((fVar1 < fVar8 || (fVar11 < fVar1)) ||
      ((fVar1 = (i->mouse).prev.y, fVar1 < fVar9 || (uVar6 = 0x40, fVar9 + fVar10 < fVar1)))))) {
    return iVar4;
  }
  *state = uVar5 | uVar6;
  return iVar4;
}

Assistant:

NK_INTERN int
nk_button_behavior(nk_flags *state, struct nk_rect r,
    const struct nk_input *i, enum nk_button_behavior behavior)
{
    int ret = 0;
    nk_widget_state_reset(state);
    if (!i) return 0;
    if (nk_input_is_mouse_hovering_rect(i, r)) {
        *state = NK_WIDGET_STATE_HOVERED;
        if (nk_input_is_mouse_down(i, NK_BUTTON_LEFT))
            *state = NK_WIDGET_STATE_ACTIVE;
        if (nk_input_has_mouse_click_in_rect(i, NK_BUTTON_LEFT, r)) {
            ret = (behavior != NK_BUTTON_DEFAULT) ?
                nk_input_is_mouse_down(i, NK_BUTTON_LEFT):
#ifdef NK_BUTTON_TRIGGER_ON_RELEASE
                nk_input_is_mouse_released(i, NK_BUTTON_LEFT);
#else
                nk_input_is_mouse_pressed(i, NK_BUTTON_LEFT);
#endif
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_LEFT;
    return ret;
}